

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_udunits.cpp
# Opt level: O1

void __thiscall UDUNITS_acceptedAlias_Test::TestBody(UDUNITS_acceptedAlias_Test *this)

{
  unit uVar1;
  char cVar2;
  bool bVar3;
  XMLError XVar4;
  int iVar5;
  XMLElement *pXVar6;
  char *pcVar7;
  uint64_t uVar8;
  XMLElement *pXVar9;
  size_t sVar10;
  ostream *poVar11;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer message;
  char *in_R9;
  pointer *__ptr;
  undefined4 uVar12;
  undefined4 uVar13;
  precise_unit pVar14;
  int failConvert;
  string def;
  AssertionResult gtest_ar_;
  XMLDocument doc;
  unit local_410;
  AssertHelper local_408;
  undefined1 local_400 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0;
  double local_3e0;
  unit local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3d0;
  long local_3c8 [2];
  XMLElement *local_3b8;
  unit local_3b0;
  string local_3a8;
  ulong local_388;
  XMLElement *local_380;
  string local_378;
  string local_358;
  XMLDocument local_338;
  
  tinyxml2::XMLDocument::XMLDocument(&local_338,true,PRESERVE_WHITESPACE);
  XVar4 = tinyxml2::XMLDocument::LoadFile
                    (&local_338,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/files/UDUNITS2/udunits2-accepted.xml"
                    );
  local_3d8.multiplier_._0_1_ = XVar4 == XML_SUCCESS;
  local_3d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (XVar4 == XML_SUCCESS) {
    pXVar6 = tinyxml2::XMLNode::FirstChildElement(&local_338.super_XMLNode,"unit-system");
    pXVar6 = tinyxml2::XMLNode::FirstChildElement(&pXVar6->super_XMLNode,"unit");
    local_408.data_._0_4_ = 0;
    if (pXVar6 != (XMLElement *)0x0) {
      do {
        local_3b8 = pXVar6;
        pXVar6 = tinyxml2::XMLNode::FirstChildElement(&pXVar6->super_XMLNode,"def");
        pcVar7 = tinyxml2::XMLNode::Value((pXVar6->super_XMLNode)._firstChild);
        std::__cxx11::string::string((string *)local_400,pcVar7,(allocator *)&local_3d8);
        local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3a8,CONCAT71(local_400._1_7_,local_400[0]),
                   (long)&(local_3f8->_M_dataplus)._M_p + CONCAT71(local_400._1_7_,local_400[0]));
        uVar8 = units::getDefaultFlags();
        pVar14 = units::unit_from_string(&local_3a8,uVar8);
        local_3e0 = pVar14.multiplier_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
          operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
        }
        pXVar6 = tinyxml2::XMLNode::FirstChildElement(&local_3b8->super_XMLNode,"aliases");
        if (pXVar6 == (XMLElement *)0x0) {
          pXVar6 = tinyxml2::XMLNode::NextSiblingElement(&local_3b8->super_XMLNode,"unit");
        }
        else {
          local_380 = pXVar6;
          pXVar6 = tinyxml2::XMLNode::FirstChildElement(&pXVar6->super_XMLNode,"name");
          local_388 = (ulong)(uint)(float)local_3e0;
          local_3b0 = (unit)(pVar14._8_8_ << 0x20);
          uVar1 = (unit)(local_388 + (long)local_3b0);
          for (; pXVar6 != (XMLElement *)0x0;
              pXVar6 = tinyxml2::XMLNode::NextSiblingElement(&pXVar6->super_XMLNode,"name")) {
            pXVar9 = tinyxml2::XMLNode::FirstChildElement(&pXVar6->super_XMLNode,"singular");
            pcVar7 = tinyxml2::XMLNode::Value((pXVar9->super_XMLNode)._firstChild);
            std::__cxx11::string::string((string *)&local_358,pcVar7,(allocator *)&local_3d8);
            uVar8 = units::getDefaultFlags();
            pVar14 = units::unit_from_string(&local_358,uVar8);
            uVar12 = pVar14.multiplier_._0_4_;
            uVar13 = pVar14.multiplier_._4_4_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._M_dataplus._M_p != &local_358.field_2) {
              local_3e0 = pVar14.multiplier_;
              operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1
                             );
              uVar12 = SUB84(local_3e0,0);
              uVar13 = (undefined4)((ulong)local_3e0 >> 0x20);
            }
            if ((pVar14._8_8_ & 0xffffffff) == 0xfa94a488 ||
                (NAN((double)CONCAT44(uVar13,uVar12)) || NAN((double)CONCAT44(uVar13,uVar12)))) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"unable to convert ",0x12);
              if (pcVar7 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1c0430);
              }
              else {
                sVar10 = strlen(pcVar7);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pcVar7,sVar10);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout," into a valid unit def=",0x17);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   (char *)CONCAT71(local_400._1_7_,local_400[0]),(long)local_3f8);
              local_3d8.multiplier_._0_1_ = 10;
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_3d8,1);
LAB_0012a42a:
              local_408.data_._0_4_ = (int)local_408.data_ + 1;
            }
            else {
              local_3d8 = (unit)((ulong)(uint)(float)(double)CONCAT44(uVar13,uVar12) |
                                pVar14._8_8_ << 0x20);
              local_410 = uVar1;
              bVar3 = units::unit::operator==(&local_3d8,&local_410);
              if (!bVar3) {
                std::__cxx11::string::string((string *)&local_3d8,pcVar7,(allocator *)&local_410);
                iVar5 = std::__cxx11::string::compare((char *)&local_3d8);
                if (local_3d8 != (unit)local_3c8) {
                  operator_delete((void *)local_3d8,local_3c8[0] + 1);
                }
                if (iVar5 != 0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"name and unit do not match ",0x1b);
                  if (pcVar7 == (char *)0x0) {
                    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1c0430);
                  }
                  else {
                    sVar10 = strlen(pcVar7);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,pcVar7,sVar10);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout," and ",5);
                  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,
                                       (char *)CONCAT71(local_400._1_7_,local_400[0]),
                                       (long)local_3f8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                  goto LAB_0012a42a;
                }
              }
            }
          }
          pXVar6 = tinyxml2::XMLNode::FirstChildElement(&local_380->super_XMLNode,"symbol");
          local_3b0 = (unit)((long)local_3b0 + local_388);
          for (; pXVar6 != (XMLElement *)0x0;
              pXVar6 = tinyxml2::XMLNode::NextSiblingElement(&pXVar6->super_XMLNode,"symbol")) {
            pcVar7 = tinyxml2::XMLNode::Value((pXVar6->super_XMLNode)._firstChild);
            std::__cxx11::string::string((string *)&local_378,pcVar7,(allocator *)&local_3d8);
            uVar8 = units::getDefaultFlags();
            pVar14 = units::unit_from_string(&local_378,uVar8);
            uVar12 = pVar14.multiplier_._0_4_;
            uVar13 = pVar14.multiplier_._4_4_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._M_dataplus._M_p != &local_378.field_2) {
              local_3e0 = pVar14.multiplier_;
              operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1
                             );
              uVar12 = SUB84(local_3e0,0);
              uVar13 = (undefined4)((ulong)local_3e0 >> 0x20);
            }
            if ((pVar14._8_8_ & 0xffffffff) == 0xfa94a488 ||
                (NAN((double)CONCAT44(uVar13,uVar12)) || NAN((double)CONCAT44(uVar13,uVar12)))) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"unable to convert ",0x12);
              if (pcVar7 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1c0430);
              }
              else {
                sVar10 = strlen(pcVar7);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pcVar7,sVar10);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout," into a valid unit def=",0x17);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   (char *)CONCAT71(local_400._1_7_,local_400[0]),(long)local_3f8);
              local_3d8.multiplier_._0_1_ = 10;
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_3d8,1);
LAB_0012a682:
              local_408.data_._0_4_ = (int)local_408.data_ + 1;
            }
            else {
              local_3d8 = (unit)((ulong)(uint)(float)(double)CONCAT44(uVar13,uVar12) |
                                pVar14._8_8_ << 0x20);
              local_410 = local_3b0;
              bVar3 = units::unit::operator==(&local_3d8,&local_410);
              if (!bVar3) {
                std::__cxx11::string::string((string *)&local_3d8,pcVar7,(allocator *)&local_410);
                iVar5 = std::__cxx11::string::compare((char *)&local_3d8);
                if (local_3d8 != (unit)local_3c8) {
                  operator_delete((void *)local_3d8,local_3c8[0] + 1);
                }
                if (iVar5 != 0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"name and unit do not match ",0x1b);
                  if (pcVar7 == (char *)0x0) {
                    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1c0430);
                  }
                  else {
                    sVar10 = strlen(pcVar7);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,pcVar7,sVar10);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout," and ",5);
                  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,
                                       (char *)CONCAT71(local_400._1_7_,local_400[0]),
                                       (long)local_3f8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                  goto LAB_0012a682;
                }
              }
            }
          }
          pXVar6 = tinyxml2::XMLNode::NextSiblingElement(&local_3b8->super_XMLNode,"unit");
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_400._1_7_,local_400[0]) != &local_3f0) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_400._1_7_,local_400[0]),
                          local_3f0._M_allocated_capacity + 1);
        }
      } while (pXVar6 != (XMLElement *)0x0);
    }
    local_3d8 = (unit)((ulong)local_3d8 & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_400,"failConvert","0",(int *)&local_408,(int *)&local_3d8);
    if (local_400[0] == (string)0x0) {
      testing::Message::Message((Message *)&local_3d8);
      if (local_3f8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = (local_3f8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_410,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_udunits.cpp"
                 ,0x87,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_410,(Message *)&local_3d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_410);
      if (local_3d8 != (unit)0x0) {
        (**(code **)(*(long *)local_3d8 + 8))();
      }
    }
    if (local_3f8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0012a794;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_3f8;
  }
  else {
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_3d0;
    testing::Message::Message((Message *)&local_410);
    std::ostream::operator<<((ostream *)((long)local_410 + 0x10),XVar4);
    cVar2 = local_410.multiplier_._0_1_ + '\x10';
    std::ios::widen((char)*(undefined8 *)(*(long *)((long)local_410 + 0x10) + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_400,(internal *)&local_3d8,(AssertionResult *)0x180888,"true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_408,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_udunits.cpp"
               ,0x4f,(char *)CONCAT71(local_400._1_7_,local_400[0]));
    testing::internal::AssertHelper::operator=(&local_408,(Message *)&local_410);
    testing::internal::AssertHelper::~AssertHelper(&local_408);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_400._1_7_,local_400[0]) != &local_3f0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_400._1_7_,local_400[0]),local_3f0._M_allocated_capacity + 1)
      ;
    }
    if (local_410 != (unit)0x0) {
      (**(code **)(*(long *)local_410 + 8))();
    }
    local_3f8 = local_3d0;
    if (local_3d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0012a794;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_3f8);
LAB_0012a794:
  tinyxml2::XMLDocument::~XMLDocument(&local_338);
  return;
}

Assistant:

TEST(UDUNITS, acceptedAlias)
{
    tinyxml2::XMLDocument doc;
    auto err = doc.LoadFile(TEST_FILE_FOLDER "/UDUNITS2/udunits2-accepted.xml");
    ASSERT_FALSE(err) << err << std::endl;
    auto cs = doc.FirstChildElement("unit-system")->FirstChildElement("unit");
    int failConvert{0};
    while (cs != nullptr) {
        std::string def = cs->FirstChildElement("def")->FirstChild()->Value();

        auto definitionUnit = units::unit_from_string(def);

        auto alias = cs->FirstChildElement("aliases");
        if (!alias) {
            cs = cs->NextSiblingElement("unit");
            continue;
        }
        auto name = alias->FirstChildElement("name");
        while (name != nullptr) {
            auto sname =
                name->FirstChildElement("singular")->FirstChild()->Value();
            auto nameUnit = units::unit_from_string(sname);
            if (is_error(nameUnit)) {
                std::cout << "unable to convert " << sname
                          << " into a valid unit def=" << def << '\n';
                ++failConvert;
            } else {
                if (unit_cast(nameUnit) != unit_cast(definitionUnit)) {
                    if (std::string(sname) != "gal") {
                        std::cout << "name and unit do not match " << sname
                                  << " and " << def << "\n";
                        ++failConvert;
                    }
                }
            }
            name = name->NextSiblingElement("name");
        }
        // check for symbols
        auto sym = alias->FirstChildElement("symbol");
        while (sym != nullptr) {
            auto symString = sym->FirstChild()->Value();
            auto symUnit = units::unit_from_string(symString);
            if (is_error(symUnit)) {
                std::cout << "unable to convert " << symString
                          << " into a valid unit def=" << def << '\n';
                ++failConvert;
            } else {
                if (unit_cast(symUnit) != unit_cast(definitionUnit)) {
                    if (std::string(symString) != "a") {
                        std::cout << "name and unit do not match " << symString
                                  << " and " << def << "\n";
                        ++failConvert;
                    }
                }
            }
            sym = sym->NextSiblingElement("symbol");
        }

        cs = cs->NextSiblingElement("unit");
    }
    EXPECT_EQ(failConvert, 0);
}